

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

SynFunctionDefinition * ParseFunctionDefinition(ParseContext *ctx)

{
  LexemeType LVar1;
  LexemeType LVar2;
  LexemeType LVar3;
  uint uVar4;
  Lexeme *begin;
  Lexeme *pLVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  int iVar9;
  bool *pbVar10;
  SynBase *pSVar11;
  SynBase *pSVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Lexeme *pLVar13;
  SynIdentifier *node;
  undefined4 extraout_var_03;
  SynFunctionDefinition *pSVar14;
  undefined4 extraout_var_05;
  char *pcVar15;
  uint uVar16;
  SynBase *pSVar17;
  ulong uVar18;
  char *pcVar19;
  IntrusiveList<SynFunctionArgument> IVar20;
  IntrusiveList<SynBase> IVar21;
  IntrusiveList<SynIdentifier> aliases;
  TraceScope traceScope;
  bool local_98;
  IntrusiveList<SynIdentifier> local_68;
  SynIdentifier *local_58;
  SynIdentifier *pSStack_50;
  SynFunctionArgument *local_48;
  TraceScope local_40;
  SynIdentifier *this;
  undefined4 extraout_var_02;
  undefined4 extraout_var_04;
  
  begin = ctx->currentLexeme;
  local_58 = (SynIdentifier *)
             CONCAT44(local_58._4_4_,(int)((ulong)((long)begin - (long)ctx->firstLexeme) >> 5) + 1);
  pbVar10 = SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U>::find
                      (&ctx->nonFunctionDefinitionLocations,(uint *)&local_58);
  if (pbVar10 != (bool *)0x0) {
    return (SynFunctionDefinition *)0x0;
  }
  LVar1 = ctx->currentLexeme->type;
  if (LVar1 == lex_coroutine) {
    ctx->currentLexeme = ctx->currentLexeme + 1;
  }
  pSVar11 = ParseType(ctx,(bool *)0x0,false);
  if (pSVar11 == (SynBase *)0x0) {
    if (LVar1 != lex_coroutine) {
      return (SynFunctionDefinition *)0x0;
    }
    pLVar13 = ctx->currentLexeme;
    pcVar19 = "ERROR: function return type not found after \'coroutine\'";
    goto LAB_00222a5f;
  }
  pLVar13 = ctx->currentLexeme;
  pSVar17 = (SynBase *)0x0;
  pSVar12 = ParseType(ctx,(bool *)0x0,false);
  if (pSVar12 == (SynBase *)0x0) {
    local_98 = false;
  }
  else {
    pLVar5 = ctx->currentLexeme;
    if (pLVar5->type == lex_colon) {
      local_98 = false;
LAB_00222313:
      pLVar13 = pLVar5 + 1;
    }
    else {
      pLVar5 = ctx->currentLexeme;
      if (pLVar5->type == lex_point) {
        local_98 = true;
        goto LAB_00222313;
      }
      local_98 = false;
      pSVar12 = (SynBase *)0x0;
    }
    ctx->currentLexeme = pLVar13;
    pSVar17 = pSVar12;
  }
  uVar16 = pSVar11->typeID;
  pLVar13 = ctx->currentLexeme;
  LVar2 = pLVar13->type;
  if (LVar2 == lex_operator) {
    ctx->currentLexeme = pLVar13 + 1;
    if (pLVar13[1].type == lex_obracket) {
      ctx->currentLexeme = pLVar13 + 2;
      anon_unknown.dwarf_16d1cf::CheckConsume
                (ctx,lex_cbracket,"ERROR: \']\' not found after \'[\' in operator definition");
      iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      this = (SynIdentifier *)CONCAT44(extraout_var,iVar9);
      pLVar13 = ctx->currentLexeme;
      if (pLVar13 <= ctx->firstLexeme) goto LAB_00222a2d;
      pcVar15 = "";
      pcVar19 = "[]";
    }
    else {
      if (ctx->currentLexeme->type != lex_oparen) {
        pLVar13 = ctx->currentLexeme;
        LVar3 = pLVar13->type;
        if ((0x14 < LVar3 - lex_add) &&
           (0xb < LVar3 - lex_set && (LVar3 & ~lex_number) != lex_bitnot)) {
          pcVar19 = "ERROR: invalid operator name";
          goto LAB_00222a5f;
        }
        pcVar19 = pLVar13->pos;
        uVar18 = (ulong)pLVar13->length;
        if (LVar3 != lex_none) goto LAB_002224af;
        goto LAB_002224ba;
      }
      ctx->currentLexeme = ctx->currentLexeme + 1;
      anon_unknown.dwarf_16d1cf::CheckConsume
                (ctx,lex_cparen,"ERROR: \')\' not found after \'(\' in operator definition");
      iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      this = (SynIdentifier *)CONCAT44(extraout_var_00,iVar9);
      pLVar13 = ctx->currentLexeme;
      if (pLVar13 <= ctx->firstLexeme) goto LAB_00222a2d;
      pcVar15 = "";
      pcVar19 = "()";
    }
LAB_002224e6:
    SynBase::SynBase(&this->super_SynBase,4,pLVar13 + -1,pLVar13 + -1);
    (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f6178;
    (this->name).begin = pcVar19;
    (this->name).end = pcVar15;
  }
  else {
    pLVar13 = ctx->currentLexeme;
    if (pLVar13->type == lex_string) {
      pcVar19 = pLVar13->pos;
      uVar18 = (ulong)pLVar13->length;
LAB_002224af:
      ctx->currentLexeme = pLVar13 + 1;
LAB_002224ba:
      iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      this = (SynIdentifier *)CONCAT44(extraout_var_01,iVar9);
      pLVar13 = ctx->currentLexeme;
      if (pLVar13 <= ctx->firstLexeme) goto LAB_00222a2d;
      pcVar15 = pcVar19 + uVar18;
      goto LAB_002224e6;
    }
    if (pSVar17 != (SynBase *)0x0) {
      pcVar19 = "ERROR: function name expected after \':\' or \'.\'";
LAB_00222a5f:
      anon_unknown.dwarf_16d1cf::Stop(ctx,pLVar13,pcVar19);
    }
    if (LVar1 == lex_coroutine && uVar16 != 5) {
      pcVar19 = "ERROR: function name not found after return type";
      goto LAB_00222a5f;
    }
    this = (SynIdentifier *)0x0;
  }
  local_68.head = (SynIdentifier *)0x0;
  local_68.tail = (SynIdentifier *)0x0;
  if ((this != (SynIdentifier *)0x0) && (pLVar13 = ctx->currentLexeme, pLVar13->type == lex_less)) {
    do {
      ctx->currentLexeme = pLVar13 + 1;
      pcVar19 = "ERROR: \'@\' is expected after \',\' in explicit generic type alias list";
      if (local_68.head == (SynIdentifier *)0x0) {
        pcVar19 = "ERROR: \'@\' is expected before explicit generic type alias";
      }
      anon_unknown.dwarf_16d1cf::CheckConsume(ctx,lex_at,pcVar19);
      bVar8 = anon_unknown.dwarf_16d1cf::CheckAt
                        (ctx,lex_string,"ERROR: explicit generic type alias is expected after \'@\'"
                        );
      if (bVar8) {
        pLVar13 = ctx->currentLexeme;
        pcVar19 = pLVar13->pos;
        uVar4 = pLVar13->length;
        if (pLVar13->type != lex_none) {
          ctx->currentLexeme = pLVar13 + 1;
        }
        iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        node = (SynIdentifier *)CONCAT44(extraout_var_02,iVar9);
        if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_00222a2d;
        pLVar13 = ctx->currentLexeme + -1;
        SynBase::SynBase((SynBase *)node,4,pLVar13,pLVar13);
        (node->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f6178;
        (node->name).begin = pcVar19;
        (node->name).end = pcVar19 + uVar4;
        IntrusiveList<SynIdentifier>::push_back(&local_68,node);
      }
      pLVar13 = ctx->currentLexeme;
    } while (pLVar13->type == lex_comma);
    anon_unknown.dwarf_16d1cf::CheckConsume
              (ctx,lex_greater,"ERROR: \'>\' not found after explicit generic type alias list");
  }
  if (((LVar1 == lex_coroutine) || (pSVar17 != (SynBase *)0x0)) ||
     (local_68.head != (SynIdentifier *)0x0)) {
    anon_unknown.dwarf_16d1cf::CheckAt(ctx,lex_oparen,"ERROR: \'(\' expected after function name");
  }
  if (((uVar16 != 5) && (this == (SynIdentifier *)0x0)) || (ctx->currentLexeme->type != lex_oparen))
  {
    ctx->currentLexeme = begin;
    local_58 = (SynIdentifier *)
               CONCAT44(local_58._4_4_,(int)((ulong)((long)begin - (long)ctx->firstLexeme) >> 5) + 1
                       );
    local_40.ts._0_1_ = 1;
    SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U>::insert
              (&ctx->nonFunctionDefinitionLocations,(uint *)&local_58,(bool *)&local_40);
    return (SynFunctionDefinition *)0x0;
  }
  ctx->currentLexeme = ctx->currentLexeme + 1;
  IVar20 = ParseFunctionArguments(ctx);
  anon_unknown.dwarf_16d1cf::CheckConsume
            (ctx,lex_cparen,"ERROR: \')\' not found after function variable list");
  if (this == (SynIdentifier *)0x0) {
    iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    this = (SynIdentifier *)CONCAT44(extraout_var_03,iVar9);
    (this->super_SynBase).typeID = 4;
    (this->super_SynBase).begin = (Lexeme *)0x0;
    (this->super_SynBase).end = (Lexeme *)0x0;
    (this->super_SynBase).pos.begin = (char *)0x0;
    (this->super_SynBase).pos.end = (char *)0x0;
    *(undefined8 *)((long)&(this->super_SynBase).pos.end + 2) = 0;
    *(undefined8 *)((long)&(this->super_SynBase).next + 2) = 0;
    (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f6178;
    (this->name).begin = (char *)0x0;
    (this->name).end = (char *)0x0;
  }
  if (ctx->currentLexeme->type == lex_semicolon) {
    ctx->currentLexeme = ctx->currentLexeme + 1;
    iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x98);
    pSVar14 = (SynFunctionDefinition *)CONCAT44(extraout_var_04,iVar9);
    if (ctx->firstLexeme < ctx->currentLexeme) {
      local_58 = local_68.head;
      pSStack_50 = local_68.tail;
      SynBase::SynBase((SynBase *)pSVar14,0x37,begin,ctx->currentLexeme + -1);
      (pSVar14->super_SynBase).field_0x3b = LVar1 == lex_coroutine;
      (pSVar14->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f6d70;
      (pSVar14->super_SynBase).field_0x3a = 1;
      pSVar14->parentType = pSVar17;
      pSVar14->accessor = local_98;
      pSVar14->returnType = pSVar11;
      pSVar14->isOperator = LVar2 == lex_operator;
      pSVar14->name = this;
      (pSVar14->aliases).head = local_58;
      (pSVar14->aliases).tail = pSStack_50;
      pSVar14->arguments = IVar20;
      (pSVar14->expressions).head = (SynBase *)0x0;
      (pSVar14->expressions).tail = (SynBase *)0x0;
      return pSVar14;
    }
  }
  else {
    local_48 = IVar20.tail;
    anon_unknown.dwarf_16d1cf::CheckConsume
              (ctx,lex_ofigure,"ERROR: \'{\' not found after function header");
    if ((ParseFunctionDefinition(ParseContext&)::token == '\0') &&
       (iVar9 = __cxa_guard_acquire(&ParseFunctionDefinition(ParseContext&)::token), iVar9 != 0)) {
      ParseFunctionDefinition::token = NULLC::TraceGetToken("parse","ParseFunctionBody");
      __cxa_guard_release(&ParseFunctionDefinition(ParseContext&)::token);
    }
    NULLC::TraceScope::TraceScope(&local_40,ParseFunctionDefinition::token);
    lVar7 = NULLC::traceContext;
    pcVar19 = (this->name).begin;
    uVar18 = (long)(this->name).end - (long)pcVar19;
    iVar9 = (int)uVar18;
    if (iVar9 != 0) {
      uVar16 = iVar9 + 1;
      if ((*(uint *)(NULLC::traceContext + 0x264) <= *(int *)(NULLC::traceContext + 0x260) + uVar16)
         || (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
        NULLC::TraceDump();
      }
      if (*(uint *)(lVar7 + 0x264) <= uVar16) {
        __assert_fail("count + 1 < context.labels.max",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                      ,0x142,"void NULLC::TraceLabel(const char *, const char *)");
      }
      uVar4 = *(uint *)(lVar7 + 0x260);
      memcpy((void *)((ulong)uVar4 + *(long *)(lVar7 + 0x268)),pcVar19,uVar18 & 0xffffffff);
      *(undefined1 *)(*(long *)(lVar7 + 0x268) + (ulong)(uint)(*(int *)(lVar7 + 0x260) + iVar9)) = 0
      ;
      *(int *)(lVar7 + 0x260) = *(int *)(lVar7 + 0x260) + uVar16;
      lVar6 = *(long *)(lVar7 + 0x278);
      uVar16 = *(uint *)(lVar7 + 0x270);
      *(uint *)(lVar7 + 0x270) = uVar16 + 1;
      *(uint *)(lVar6 + (ulong)uVar16 * 8) = uVar4 * 4 + 2;
      *(undefined4 *)(lVar6 + 4 + (ulong)uVar16 * 8) = 0;
    }
    IVar21 = ParseExpressions(ctx);
    anon_unknown.dwarf_16d1cf::CheckConsume
              (ctx,lex_cfigure,"ERROR: \'}\' not found after function body");
    iVar9 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x98);
    pSVar14 = (SynFunctionDefinition *)CONCAT44(extraout_var_05,iVar9);
    if (ctx->firstLexeme < ctx->currentLexeme) {
      local_58 = local_68.head;
      pSStack_50 = local_68.tail;
      SynBase::SynBase((SynBase *)pSVar14,0x37,begin,ctx->currentLexeme + -1);
      (pSVar14->super_SynBase).field_0x3b = LVar1 == lex_coroutine;
      (pSVar14->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f6d70;
      (pSVar14->super_SynBase).field_0x3a = 0;
      pSVar14->parentType = pSVar17;
      pSVar14->accessor = local_98;
      pSVar14->returnType = pSVar11;
      pSVar14->isOperator = LVar2 == lex_operator;
      pSVar14->name = this;
      (pSVar14->aliases).head = local_58;
      (pSVar14->aliases).tail = pSStack_50;
      (pSVar14->arguments).head = IVar20.head;
      (pSVar14->arguments).tail = local_48;
      pSVar14->expressions = IVar21;
      NULLC::TraceScope::~TraceScope(&local_40);
      return pSVar14;
    }
  }
LAB_00222a2d:
  __assert_fail("currentLexeme > firstLexeme",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                ,0x19c,"Lexeme *ParseContext::Previous()");
}

Assistant:

SynFunctionDefinition* ParseFunctionDefinition(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.nonFunctionDefinitionLocations.find(unsigned(start - ctx.firstLexeme) + 1))
		return NULL;

	bool coroutine = ctx.Consume(lex_coroutine);

	if(SynBase *returnType = ParseType(ctx))
	{
		// Check if this is a member function
		Lexeme *subLexeme = ctx.currentLexeme;

		SynBase *parentType = ParseType(ctx);
		bool accessor = false;

		if(parentType)
		{
			if(ctx.Consume(lex_colon))
			{
				accessor = false;
			}
			else if(ctx.Consume(lex_point))
			{
				accessor = true;
			}
			else
			{
				// Backtrack
				ctx.currentLexeme = subLexeme;

				parentType = NULL;
			}
		}

		bool allowEmptyName = isType<SynTypeAuto>(returnType);

		bool isOperator = ctx.Consume(lex_operator);

		SynIdentifier *nameIdentifier = NULL;

		if(isOperator)
		{
			if(ctx.Consume(lex_obracket))
			{
				CheckConsume(ctx, lex_cbracket, "ERROR: ']' not found after '[' in operator definition");

				InplaceStr name = InplaceStr("[]");
				nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
			}
			else if(ctx.Consume(lex_oparen))
			{
				CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after '(' in operator definition");

				InplaceStr name = InplaceStr("()");
				nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
			}
			else if((ctx.Peek() >= lex_add && ctx.Peek() <= lex_in) || (ctx.Peek() >= lex_set && ctx.Peek() <= lex_xorset) || ctx.Peek() == lex_bitnot || ctx.Peek() == lex_lognot)
			{
				InplaceStr name = ctx.Consume();
				nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
			}
			else
			{
				Stop(ctx, ctx.Current(), "ERROR: invalid operator name");
			}
		}
		else if(ctx.At(lex_string))
		{
			InplaceStr name = ctx.Consume();
			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
		}
		else if(parentType)
		{
			Stop(ctx, ctx.Current(), "ERROR: function name expected after ':' or '.'");
		}
		else if(coroutine && !allowEmptyName)
		{
			Stop(ctx, ctx.Current(), "ERROR: function name not found after return type");
		}

		IntrusiveList<SynIdentifier> aliases;

		if(nameIdentifier && ctx.Consume(lex_less))
		{
			do
			{
				if(aliases.empty())
					CheckConsume(ctx, lex_at, "ERROR: '@' is expected before explicit generic type alias");
				else
					CheckConsume(ctx, lex_at, "ERROR: '@' is expected after ',' in explicit generic type alias list");

				if(CheckAt(ctx, lex_string, "ERROR: explicit generic type alias is expected after '@'"))
				{
					InplaceStr name = ctx.Consume();
					aliases.push_back(new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name));
				}
			}
			while(ctx.Consume(lex_comma));

			CheckConsume(ctx, lex_greater, "ERROR: '>' not found after explicit generic type alias list");
		}

		if(parentType || coroutine || !aliases.empty())
			CheckAt(ctx, lex_oparen, "ERROR: '(' expected after function name");

		if((nameIdentifier == NULL && !allowEmptyName) || !ctx.Consume(lex_oparen))
		{
			// Backtrack
			ctx.currentLexeme = start;
			ctx.nonFunctionDefinitionLocations.insert(unsigned(start - ctx.firstLexeme) + 1, true);

			return NULL;
		}

		IntrusiveList<SynFunctionArgument> arguments = ParseFunctionArguments(ctx);

		CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after function variable list");

		if(!nameIdentifier)
			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr());

		IntrusiveList<SynBase> expressions;

		if(ctx.Consume(lex_semicolon))
			return new (ctx.get<SynFunctionDefinition>()) SynFunctionDefinition(start, ctx.Previous(), true, coroutine, parentType, accessor, returnType, isOperator, nameIdentifier, aliases, arguments, expressions);

		CheckConsume(ctx, lex_ofigure, "ERROR: '{' not found after function header");

		TRACE_SCOPE("parse", "ParseFunctionBody");

		if(nameIdentifier)
			TRACE_LABEL2(nameIdentifier->name.begin, nameIdentifier->name.end);

		expressions = ParseExpressions(ctx);

		CheckConsume(ctx, lex_cfigure, "ERROR: '}' not found after function body");

		return new (ctx.get<SynFunctionDefinition>()) SynFunctionDefinition(start, ctx.Previous(), false, coroutine, parentType, accessor, returnType, isOperator, nameIdentifier, aliases, arguments, expressions);
	}
	else if(coroutine)
	{
		Stop(ctx, ctx.Current(), "ERROR: function return type not found after 'coroutine'");
	}

	return NULL;
}